

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * __thiscall
iutest::detail::StringFormat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *format,__va_list_tag *va)

{
  int iVar1;
  size_t sVar2;
  char *dst_00;
  int *piVar3;
  ulong uVar4;
  allocator<char> local_8d [15];
  allocator local_7e;
  undefined1 local_7d;
  int local_7c;
  undefined1 auStack_78 [4];
  int written;
  va_list va2_1;
  char *dst;
  undefined1 auStack_48 [4];
  int ret;
  va_list va2;
  ulong local_28;
  size_t n;
  __va_list_tag *va_local;
  char *format_local;
  string *s;
  
  sVar2 = strlen((char *)this);
  local_28 = sVar2 * 2 + 1;
  va2[0].overflow_arg_area = *(void **)(format + 0x10);
  _auStack_48 = *(undefined8 *)format;
  va2[0]._0_8_ = *(undefined8 *)(format + 8);
  iVar1 = iu_vsnprintf((char *)0x0,0,(char *)this,(__va_list_tag *)auStack_48);
  if (0 < iVar1) {
    local_28 = (ulong)(iVar1 + 1);
  }
  do {
    dst_00 = (char *)operator_new__(local_28);
    va2_1[0].overflow_arg_area = *(void **)(format + 0x10);
    _auStack_78 = *(undefined8 *)format;
    va2_1[0]._0_8_ = *(undefined8 *)(format + 8);
    local_7c = iu_vsnprintf(dst_00,local_28,(char *)this,(__va_list_tag *)auStack_78);
    if (local_7c < 0) {
      piVar3 = __errno_location();
      if ((*piVar3 == 0x4b) || (piVar3 = __errno_location(), *piVar3 == 7)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",local_8d);
        std::allocator<char>::~allocator(local_8d);
        return __return_storage_ptr__;
      }
    }
    else if ((ulong)(long)local_7c < local_28) {
      local_7d = 0;
      uVar4 = (ulong)local_7c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,dst_00,uVar4,&local_7e);
      std::allocator<char>::~allocator((allocator<char> *)&local_7e);
      if (dst_00 != (char *)0x0) {
        operator_delete__(dst_00);
      }
      return __return_storage_ptr__;
    }
    if (dst_00 != (char *)0x0) {
      operator_delete__(dst_00);
    }
    local_28 = local_28 << 1;
  } while( true );
}

Assistant:

inline ::std::string StringFormat(const char* format, va_list va)
{
    size_t n = strlen(format) * 2 + 1;
    {
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int ret = iu_vsnprintf(NULL, 0u, format, va2);
        va_end(va2);
        if( ret > 0 )
        {
            n = static_cast<size_t>(ret + 1);
        }
    }
    for( ;; )
    {
        char* dst = new char[n];
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int written = iu_vsnprintf(dst, n, format, va2);
        va_end(va2);
        if( written < 0 )
        {
#if defined(EOVERFLOW)
            if( errno == EOVERFLOW )
            {
                break;
            }
#endif
#if defined(E2BIG)
            if( errno == E2BIG )
            {
                break;
            }
#endif
        }
        else if( static_cast<size_t>(written) < n )
        {
            ::std::string s = ::std::string(dst, static_cast<size_t>(written));
            delete[] dst;
            return s;
        }
        delete[] dst;
        n *= 2;
    }
    return "";
}